

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_striped_sse41_128_16.c
# Opt level: O3

parasail_result_t *
parasail_sw_stats_striped_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  undefined1 (*pauVar1) [16];
  ushort *puVar2;
  short *psVar3;
  int iVar4;
  char *s1;
  parasail_matrix_t *ppVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  uint uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  __m128i *palVar14;
  __m128i *palVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  parasail_result_t *result;
  parasail_profile_t *profile_00;
  ulong uVar19;
  parasail_result_t *result_00;
  __m128i *b;
  __m128i *palVar20;
  __m128i *palVar21;
  __m128i *b_00;
  __m128i *palVar22;
  __m128i *b_01;
  __m128i *palVar23;
  __m128i *b_02;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *ptr;
  uint uVar24;
  int iVar25;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  __m128i *ptr_00;
  int iVar26;
  ulong uVar27;
  long lVar28;
  uint uVar29;
  long lVar30;
  __m128i *palVar31;
  __m128i *palVar32;
  __m128i *ptr_01;
  ulong uVar33;
  __m128i *palVar34;
  __m128i *ptr_02;
  __m128i *palVar35;
  __m128i *ptr_03;
  short sVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  short sVar64;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  short sVar71;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  ushort uVar75;
  short sVar76;
  ushort uVar78;
  short sVar79;
  ushort uVar80;
  short sVar81;
  ushort uVar82;
  short sVar83;
  ushort uVar84;
  short sVar85;
  ushort uVar86;
  short sVar87;
  ushort uVar88;
  short sVar89;
  ushort uVar90;
  short sVar91;
  undefined1 auVar77 [16];
  ushort uVar92;
  ushort uVar95;
  ushort uVar96;
  ushort uVar97;
  short sVar98;
  undefined1 auVar94 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  ushort uVar101;
  ushort uVar104;
  ushort uVar105;
  ushort uVar106;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  __m128i c_06;
  __m128i *local_1e8;
  uint local_1dc;
  __m128i *local_1d8;
  __m128i *local_1c8;
  __m128i *local_1c0;
  __m128i *local_1a8;
  undefined8 uStack_1a0;
  ulong local_190;
  __m128i *local_188;
  __m128i *local_178;
  undefined8 uStack_170;
  __m128i *local_138;
  undefined8 uStack_130;
  undefined1 local_128 [16];
  undefined4 local_e8;
  undefined4 uStack_e4;
  short sVar36;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar93;
  
  s1 = profile->s1;
  ppVar5 = profile->matrix;
  result = parasail_sw_striped_profile_sse41_128_16(profile,s2,s2Len,open,gap);
  iVar16 = parasail_result_is_saturated(result);
  if (iVar16 != 0) {
    return result;
  }
  iVar16 = result->end_query;
  iVar4 = result->end_ref;
  profile_00 = parasail_profile_create_stats_sse_128_16(s1,iVar16 + 1,ppVar5);
  if (profile_00 == (parasail_profile_t *)0x0) {
    parasail_sw_stats_striped_profile_sse41_128_16_cold_8();
  }
  else {
    pvVar6 = (profile_00->profile16).score;
    if (pvVar6 == (void *)0x0) {
      parasail_sw_stats_striped_profile_sse41_128_16_cold_7();
    }
    else {
      ppVar5 = profile_00->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_sw_stats_striped_profile_sse41_128_16_cold_6();
      }
      else {
        uVar29 = profile_00->s1Len;
        uVar19 = (ulong)uVar29;
        if ((int)uVar29 < 1) {
          parasail_sw_stats_striped_profile_sse41_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_stats_striped_profile_sse41_128_16_cold_4();
        }
        else if (iVar4 < 0) {
          parasail_sw_stats_striped_profile_sse41_128_16_cold_3();
        }
        else if (open < 0) {
          parasail_sw_stats_striped_profile_sse41_128_16_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_stats_striped_profile_sse41_128_16_cold_1();
        }
        else {
          pvVar7 = (profile_00->profile16).matches;
          pvVar8 = (profile_00->profile16).similar;
          iVar18 = ppVar5->max;
          result_00 = parasail_result_new_stats();
          if (result_00 != (parasail_result_t *)0x0) {
            uVar33 = uVar19 + 7 >> 3;
            result_00->flag = result_00->flag | 0x8210804;
            b = parasail_memalign___m128i(0x10,uVar33);
            local_1e8 = parasail_memalign___m128i(0x10,uVar33);
            palVar20 = parasail_memalign___m128i(0x10,uVar33);
            palVar21 = parasail_memalign___m128i(0x10,uVar33);
            uStack_130 = local_138;
            local_138 = palVar21;
            b_00 = parasail_memalign___m128i(0x10,uVar33);
            palVar22 = parasail_memalign___m128i(0x10,uVar33);
            uStack_1a0 = local_1a8;
            local_1a8 = palVar22;
            b_01 = parasail_memalign___m128i(0x10,uVar33);
            palVar23 = parasail_memalign___m128i(0x10,uVar33);
            uStack_170 = local_178;
            local_178 = palVar23;
            b_02 = parasail_memalign___m128i(0x10,uVar33);
            b_03 = parasail_memalign___m128i(0x10,uVar33);
            b_04 = parasail_memalign___m128i(0x10,uVar33);
            b_05 = parasail_memalign___m128i(0x10,uVar33);
            local_1c0 = parasail_memalign___m128i(0x10,uVar33);
            local_1c8 = parasail_memalign___m128i(0x10,uVar33);
            local_188 = parasail_memalign___m128i(0x10,uVar33);
            ptr = parasail_memalign___m128i(0x10,uVar33);
            auVar41._0_8_ = -(ulong)(b == (__m128i *)0x0);
            auVar41._8_8_ = -(ulong)(local_1e8 == (__m128i *)0x0);
            auVar109._0_8_ = -(ulong)(palVar20 == (__m128i *)0x0);
            auVar109._8_8_ = -(ulong)(palVar21 == (__m128i *)0x0);
            auVar41 = packssdw(auVar41,auVar109);
            auVar72._0_8_ = -(ulong)(b_00 == (__m128i *)0x0);
            auVar72._8_8_ = -(ulong)(palVar22 == (__m128i *)0x0);
            auVar111._0_8_ = -(ulong)(b_01 == (__m128i *)0x0);
            auVar111._8_8_ = -(ulong)(palVar23 == (__m128i *)0x0);
            auVar65 = packssdw(auVar72,auVar111);
            auVar41 = packssdw(auVar41,auVar65);
            auVar65._0_8_ = -(ulong)(b_02 == (__m128i *)0x0);
            auVar65._8_8_ = -(ulong)(b_03 == (__m128i *)0x0);
            auVar68._0_8_ = -(ulong)(b_04 == (__m128i *)0x0);
            auVar68._8_8_ = -(ulong)(b_05 == (__m128i *)0x0);
            auVar65 = packssdw(auVar65,auVar68);
            auVar108._0_8_ = -(ulong)(local_1c0 == (__m128i *)0x0);
            auVar108._8_8_ = -(ulong)(local_1c8 == (__m128i *)0x0);
            auVar74._0_8_ = -(ulong)(local_188 == (__m128i *)0x0);
            auVar74._8_8_ = -(ulong)(ptr == (__m128i *)0x0);
            auVar72 = packssdw(auVar108,auVar74);
            auVar65 = packssdw(auVar65,auVar72);
            auVar41 = packsswb(auVar41,auVar65);
            if ((((((((((((((((auVar41 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar41 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar41 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar41 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar41 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar41 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar41 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar41 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar41 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar41 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar41 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar41 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar41[0xf] < '\0') {
              result_00 = (parasail_result_t *)0x0;
              goto LAB_006ae65e;
            }
            auVar41 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
            uVar38 = auVar41._0_4_;
            auVar41 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
            uVar39 = auVar41._0_4_;
            c[1] = (longlong)b_02;
            c[0] = uVar33;
            palVar21 = local_188;
            parasail_memset___m128i(b,c,(size_t)local_188);
            c_00[1] = extraout_RDX;
            c_00[0] = uVar33;
            parasail_memset___m128i(palVar20,c_00,(size_t)palVar21);
            c_01[1] = extraout_RDX_00;
            c_01[0] = uVar33;
            parasail_memset___m128i(b_00,c_01,(size_t)palVar21);
            c_02[1] = extraout_RDX_01;
            c_02[0] = uVar33;
            parasail_memset___m128i(b_01,c_02,(size_t)palVar21);
            local_190 = 0;
            c_03[1] = extraout_RDX_02;
            c_03[0] = uVar33;
            parasail_memset___m128i(b_02,c_03,(size_t)palVar21);
            c_04[1] = extraout_RDX_03;
            c_04[0] = uVar33;
            parasail_memset___m128i(b_03,c_04,(size_t)palVar21);
            c_05[1] = extraout_RDX_04;
            c_05[0] = uVar33;
            parasail_memset___m128i(b_04,c_05,(size_t)palVar21);
            c_06[1] = extraout_RDX_05;
            c_06[0] = uVar33;
            parasail_memset___m128i(b_05,c_06,(size_t)palVar21);
            uVar9 = (uint)uVar33;
            uVar24 = uVar9 - 1;
            local_1dc = 0x8000;
            uVar27 = 0;
            auVar57 = _DAT_00905040;
            auVar102 = _DAT_00905040;
            local_128 = _DAT_00905040;
            do {
              palVar35 = b_01;
              palVar34 = b_00;
              palVar32 = b;
              palVar23 = palVar20;
              palVar22 = local_1a8;
              lVar30 = (long)(int)(ppVar5->mapper[(byte)s2[uVar27]] * uVar9) * 0x10;
              iVar17 = (int)uVar27 + -2;
              b_00 = local_1a8;
              palVar21 = local_1c8;
              palVar20 = ptr;
              b_01 = local_178;
              if ((int)local_190 == iVar17) {
                b_00 = local_188;
                palVar21 = local_138;
                palVar20 = local_178;
                b_01 = ptr;
              }
              ptr = palVar20;
              b = local_1e8;
              palVar20 = local_138;
              if ((int)local_190 == iVar17) {
                b = local_1c0;
                palVar20 = local_1c8;
              }
              uVar10 = palVar35[uVar24][0];
              auVar110._0_8_ = uVar10 << 0x10;
              auVar110._8_8_ = palVar35[uVar24][1] << 0x10 | uVar10 >> 0x30;
              auVar41 = ZEXT416(0x8000);
              auVar108 = pblendw(auVar110,auVar41,1);
              uVar10 = palVar34[uVar24][0];
              auVar67._0_8_ = uVar10 << 0x10;
              auVar67._8_8_ = palVar34[uVar24][1] << 0x10 | uVar10 >> 0x30;
              auVar72 = pblendw(auVar67,auVar41,1);
              uVar10 = palVar23[uVar24][0];
              auVar115._0_8_ = uVar10 << 0x10;
              auVar115._8_8_ = palVar23[uVar24][1] << 0x10 | uVar10 >> 0x30;
              auVar65 = pblendw(auVar115,auVar41,1);
              uVar10 = palVar32[uVar24][0];
              auVar77._0_8_ = uVar10 << 0x10;
              auVar77._8_8_ = palVar32[uVar24][1] << 0x10 | uVar10 >> 0x30;
              auVar41 = pblendw(auVar77,auVar41,1);
              lVar28 = 0;
              auVar109 = _DAT_00905040;
              auVar111 = _DAT_009054f0;
              auVar68 = _DAT_00905040;
              auVar118 = _DAT_00905040;
              do {
                pauVar1 = (undefined1 (*) [16])((long)*b_02 + lVar28);
                sVar37 = *(short *)*pauVar1;
                sVar36 = *(short *)(*pauVar1 + 2);
                sVar46 = *(short *)(*pauVar1 + 4);
                sVar47 = *(short *)(*pauVar1 + 6);
                sVar48 = *(short *)(*pauVar1 + 8);
                sVar49 = *(short *)(*pauVar1 + 10);
                sVar50 = *(short *)(*pauVar1 + 0xc);
                sVar51 = *(short *)(*pauVar1 + 0xe);
                auVar67 = *pauVar1;
                auVar74 = *(undefined1 (*) [16])((long)*b_03 + lVar28);
                auVar77 = *(undefined1 (*) [16])((long)*b_04 + lVar28);
                auVar110 = *(undefined1 (*) [16])((long)*b_05 + lVar28);
                auVar41 = paddsw(auVar41,*(undefined1 (*) [16])((long)pvVar6 + lVar28 + lVar30));
                uVar92 = auVar41._0_2_;
                uVar75 = (ushort)((short)uVar92 < sVar37) * sVar37 |
                         ((short)uVar92 >= sVar37) * uVar92;
                uVar95 = auVar41._2_2_;
                uVar78 = (ushort)((short)uVar95 < sVar36) * sVar36 |
                         ((short)uVar95 >= sVar36) * uVar95;
                uVar96 = auVar41._4_2_;
                uVar80 = (ushort)((short)uVar96 < sVar46) * sVar46 |
                         ((short)uVar96 >= sVar46) * uVar96;
                uVar97 = auVar41._6_2_;
                uVar82 = (ushort)((short)uVar97 < sVar47) * sVar47 |
                         ((short)uVar97 >= sVar47) * uVar97;
                uVar101 = auVar41._8_2_;
                uVar84 = (ushort)((short)uVar101 < sVar48) * sVar48 |
                         ((short)uVar101 >= sVar48) * uVar101;
                uVar104 = auVar41._10_2_;
                uVar86 = (ushort)((short)uVar104 < sVar49) * sVar49 |
                         ((short)uVar104 >= sVar49) * uVar104;
                uVar105 = auVar41._12_2_;
                uVar106 = auVar41._14_2_;
                uVar88 = (ushort)((short)uVar105 < sVar50) * sVar50 |
                         ((short)uVar105 >= sVar50) * uVar105;
                uVar90 = (ushort)((short)uVar106 < sVar51) * sVar51 |
                         ((short)uVar106 >= sVar51) * uVar106;
                sVar37 = auVar118._0_2_;
                auVar53._0_2_ =
                     (ushort)((short)uVar75 < sVar37) * sVar37 | ((short)uVar75 >= sVar37) * uVar75;
                sVar36 = auVar118._2_2_;
                auVar53._2_2_ =
                     (ushort)((short)uVar78 < sVar36) * sVar36 | ((short)uVar78 >= sVar36) * uVar78;
                sVar46 = auVar118._4_2_;
                auVar53._4_2_ =
                     (ushort)((short)uVar80 < sVar46) * sVar46 | ((short)uVar80 >= sVar46) * uVar80;
                sVar47 = auVar118._6_2_;
                auVar53._6_2_ =
                     (ushort)((short)uVar82 < sVar47) * sVar47 | ((short)uVar82 >= sVar47) * uVar82;
                sVar48 = auVar118._8_2_;
                auVar53._8_2_ =
                     (ushort)((short)uVar84 < sVar48) * sVar48 | ((short)uVar84 >= sVar48) * uVar84;
                sVar49 = auVar118._10_2_;
                auVar53._10_2_ =
                     (ushort)((short)uVar86 < sVar49) * sVar49 | ((short)uVar86 >= sVar49) * uVar86;
                sVar50 = auVar118._12_2_;
                auVar53._12_2_ =
                     (ushort)((short)uVar88 < sVar50) * sVar50 | ((short)uVar88 >= sVar50) * uVar88;
                sVar51 = auVar118._14_2_;
                auVar53._14_2_ =
                     (ushort)((short)uVar90 < sVar51) * sVar51 | ((short)uVar90 >= sVar51) * uVar90;
                *(undefined1 (*) [16])((long)*b + lVar28) = auVar53;
                auVar41 = _DAT_00905040;
                auVar113._0_2_ = -(ushort)(sVar37 < (short)uVar75);
                auVar113._2_2_ = -(ushort)(sVar36 < (short)uVar78);
                auVar113._4_2_ = -(ushort)(sVar46 < (short)uVar80);
                auVar113._6_2_ = -(ushort)(sVar47 < (short)uVar82);
                auVar113._8_2_ = -(ushort)(sVar48 < (short)uVar84);
                auVar113._10_2_ = -(ushort)(sVar49 < (short)uVar86);
                auVar113._12_2_ = -(ushort)(sVar50 < (short)uVar88);
                auVar113._14_2_ = -(ushort)(sVar51 < (short)uVar90);
                auVar115 = pblendvb(auVar109,auVar74,auVar113);
                auVar65 = paddsw(auVar65,*(undefined1 (*) [16])((long)pvVar7 + lVar28 + lVar30));
                auVar66._0_2_ = -(ushort)(uVar92 == auVar53._0_2_);
                auVar66._2_2_ = -(ushort)(uVar95 == auVar53._2_2_);
                auVar66._4_2_ = -(ushort)(uVar96 == auVar53._4_2_);
                auVar66._6_2_ = -(ushort)(uVar97 == auVar53._6_2_);
                auVar66._8_2_ = -(ushort)(uVar101 == auVar53._8_2_);
                auVar66._10_2_ = -(ushort)(uVar104 == auVar53._10_2_);
                auVar66._12_2_ = -(ushort)(uVar105 == auVar53._12_2_);
                auVar66._14_2_ = -(ushort)(uVar106 == auVar53._14_2_);
                auVar65 = pblendvb(auVar115,auVar65,auVar66);
                auVar73._0_2_ = -(ushort)(auVar53._0_2_ == (ushort)DAT_00905040);
                auVar73._2_2_ = -(ushort)(auVar53._2_2_ == DAT_00905040._2_2_);
                auVar73._4_2_ = -(ushort)(auVar53._4_2_ == DAT_00905040._4_2_);
                auVar73._6_2_ = -(ushort)(auVar53._6_2_ == DAT_00905040._6_2_);
                auVar73._8_2_ = -(ushort)(auVar53._8_2_ == DAT_00905040._8_2_);
                auVar73._10_2_ = -(ushort)(auVar53._10_2_ == DAT_00905040._10_2_);
                auVar73._12_2_ = -(ushort)(auVar53._12_2_ == DAT_00905040._12_2_);
                auVar73._14_2_ = -(ushort)(auVar53._14_2_ == DAT_00905040._14_2_);
                auVar116 = pblendvb(auVar65,_DAT_00905040,auVar73);
                *(undefined1 (*) [16])((long)*palVar20 + lVar28) = auVar116;
                auVar115 = pblendvb(auVar68,auVar77,auVar113);
                auVar65 = paddsw(auVar72,*(undefined1 (*) [16])((long)pvVar8 + lVar28 + lVar30));
                auVar65 = pblendvb(auVar115,auVar65,auVar66);
                auVar115 = pblendvb(auVar65,auVar41,auVar73);
                *(undefined1 (*) [16])((long)*b_00 + lVar28) = auVar115;
                auVar72 = pblendvb(auVar111,auVar110,auVar113);
                auVar113 = pmovsxbw(auVar74,0x101010101010101);
                auVar65 = paddsw(auVar108,auVar113);
                auVar65 = pblendvb(auVar72,auVar65,auVar66);
                auVar72 = pblendvb(auVar65,auVar41,auVar73);
                *(undefined1 (*) [16])((long)*b_01 + lVar28) = auVar72;
                sVar37 = auVar72._0_2_;
                sVar36 = auVar115._0_2_;
                uVar101 = (ushort)(sVar36 < sVar37) * sVar37 | (ushort)(sVar36 >= sVar37) * sVar36;
                sVar37 = auVar72._2_2_;
                sVar36 = auVar115._2_2_;
                uVar84 = (ushort)(sVar36 < sVar37) * sVar37 | (ushort)(sVar36 >= sVar37) * sVar36;
                sVar37 = auVar72._4_2_;
                sVar36 = auVar115._4_2_;
                uVar86 = (ushort)(sVar36 < sVar37) * sVar37 | (ushort)(sVar36 >= sVar37) * sVar36;
                sVar37 = auVar72._6_2_;
                sVar36 = auVar115._6_2_;
                uVar104 = (ushort)(sVar36 < sVar37) * sVar37 | (ushort)(sVar36 >= sVar37) * sVar36;
                sVar37 = auVar72._8_2_;
                sVar36 = auVar115._8_2_;
                uVar88 = (ushort)(sVar36 < sVar37) * sVar37 | (ushort)(sVar36 >= sVar37) * sVar36;
                sVar37 = auVar72._10_2_;
                sVar36 = auVar115._10_2_;
                uVar105 = (ushort)(sVar36 < sVar37) * sVar37 | (ushort)(sVar36 >= sVar37) * sVar36;
                sVar37 = auVar72._12_2_;
                sVar36 = auVar115._12_2_;
                sVar46 = auVar115._14_2_;
                uVar106 = (ushort)(sVar36 < sVar37) * sVar37 | (ushort)(sVar36 >= sVar37) * sVar36;
                sVar37 = auVar72._14_2_;
                uVar90 = (ushort)(sVar46 < sVar37) * sVar37 | (ushort)(sVar46 >= sVar37) * sVar46;
                local_128._2_2_ =
                     ((short)local_128._2_2_ < (short)auVar53._2_2_) * auVar53._2_2_ |
                     (ushort)((short)local_128._2_2_ >= (short)auVar53._2_2_) * local_128._2_2_;
                local_128._0_2_ =
                     ((short)local_128._0_2_ < (short)auVar53._0_2_) * auVar53._0_2_ |
                     (ushort)((short)local_128._0_2_ >= (short)auVar53._0_2_) * local_128._0_2_;
                local_128._4_2_ =
                     ((short)local_128._4_2_ < (short)auVar53._4_2_) * auVar53._4_2_ |
                     (ushort)((short)local_128._4_2_ >= (short)auVar53._4_2_) * local_128._4_2_;
                local_128._6_2_ =
                     ((short)local_128._6_2_ < (short)auVar53._6_2_) * auVar53._6_2_ |
                     (ushort)((short)local_128._6_2_ >= (short)auVar53._6_2_) * local_128._6_2_;
                local_128._8_2_ =
                     ((short)local_128._8_2_ < (short)auVar53._8_2_) * auVar53._8_2_ |
                     (ushort)((short)local_128._8_2_ >= (short)auVar53._8_2_) * local_128._8_2_;
                local_128._10_2_ =
                     ((short)local_128._10_2_ < (short)auVar53._10_2_) * auVar53._10_2_ |
                     (ushort)((short)local_128._10_2_ >= (short)auVar53._10_2_) * local_128._10_2_;
                local_128._12_2_ =
                     ((short)local_128._12_2_ < (short)auVar53._12_2_) * auVar53._12_2_ |
                     (ushort)((short)local_128._12_2_ >= (short)auVar53._12_2_) * local_128._12_2_;
                local_128._14_2_ =
                     ((short)local_128._14_2_ < (short)auVar53._14_2_) * auVar53._14_2_ |
                     (ushort)((short)local_128._14_2_ >= (short)auVar53._14_2_) * local_128._14_2_;
                auVar11._4_4_ = uVar38;
                auVar11._0_4_ = uVar38;
                auVar11._8_4_ = uVar38;
                auVar11._12_4_ = uVar38;
                auVar41 = psubsw(auVar53,auVar11);
                auVar12._4_4_ = uVar39;
                auVar12._0_4_ = uVar39;
                auVar12._8_4_ = uVar39;
                auVar12._12_4_ = uVar39;
                auVar67 = psubsw(auVar67,auVar12);
                sVar36 = auVar41._0_2_;
                sVar58 = auVar67._0_2_;
                auVar42._0_2_ = -(ushort)(sVar58 < sVar36);
                sVar46 = auVar41._2_2_;
                sVar59 = auVar67._2_2_;
                auVar42._2_2_ = -(ushort)(sVar59 < sVar46);
                sVar47 = auVar41._4_2_;
                sVar60 = auVar67._4_2_;
                auVar42._4_2_ = -(ushort)(sVar60 < sVar47);
                sVar48 = auVar41._6_2_;
                sVar61 = auVar67._6_2_;
                auVar42._6_2_ = -(ushort)(sVar61 < sVar48);
                sVar49 = auVar41._8_2_;
                sVar62 = auVar67._8_2_;
                auVar42._8_2_ = -(ushort)(sVar62 < sVar49);
                sVar50 = auVar41._10_2_;
                sVar63 = auVar67._10_2_;
                auVar42._10_2_ = -(ushort)(sVar63 < sVar50);
                sVar51 = auVar41._12_2_;
                sVar64 = auVar67._12_2_;
                sVar52 = auVar41._14_2_;
                auVar42._12_2_ = -(ushort)(sVar64 < sVar51);
                sVar71 = auVar67._14_2_;
                auVar42._14_2_ = -(ushort)(sVar71 < sVar52);
                auVar108 = pblendvb(auVar74,auVar116,auVar42);
                auVar41 = pblendvb(auVar77,auVar115,auVar42);
                auVar65 = paddsw(auVar110,auVar113);
                auVar110 = paddsw(auVar72,auVar113);
                auVar72 = pblendvb(auVar65,auVar110,auVar42);
                auVar65 = psubsw(auVar118,auVar12);
                sVar76 = auVar65._0_2_;
                auVar54._0_2_ = -(ushort)(sVar76 < sVar36);
                sVar79 = auVar65._2_2_;
                auVar54._2_2_ = -(ushort)(sVar79 < sVar46);
                sVar81 = auVar65._4_2_;
                auVar54._4_2_ = -(ushort)(sVar81 < sVar47);
                sVar83 = auVar65._6_2_;
                auVar54._6_2_ = -(ushort)(sVar83 < sVar48);
                sVar85 = auVar65._8_2_;
                auVar54._8_2_ = -(ushort)(sVar85 < sVar49);
                sVar87 = auVar65._10_2_;
                auVar54._10_2_ = -(ushort)(sVar87 < sVar50);
                sVar89 = auVar65._12_2_;
                auVar54._12_2_ = -(ushort)(sVar89 < sVar51);
                sVar91 = auVar65._14_2_;
                auVar54._14_2_ = -(ushort)(sVar91 < sVar52);
                auVar109 = pblendvb(auVar109,auVar116,auVar54);
                sVar37 = auVar116._0_2_;
                sVar93 = auVar102._0_2_;
                uVar92 = (ushort)(sVar93 < sVar37) * sVar37 | (ushort)(sVar93 >= sVar37) * sVar93;
                sVar37 = auVar116._2_2_;
                sVar93 = auVar102._2_2_;
                uVar75 = (ushort)(sVar93 < sVar37) * sVar37 | (ushort)(sVar93 >= sVar37) * sVar93;
                sVar37 = auVar116._4_2_;
                sVar93 = auVar102._4_2_;
                uVar95 = (ushort)(sVar93 < sVar37) * sVar37 | (ushort)(sVar93 >= sVar37) * sVar93;
                sVar37 = auVar116._6_2_;
                sVar93 = auVar102._6_2_;
                uVar78 = (ushort)(sVar93 < sVar37) * sVar37 | (ushort)(sVar93 >= sVar37) * sVar93;
                sVar37 = auVar116._8_2_;
                sVar93 = auVar102._8_2_;
                uVar80 = (ushort)(sVar93 < sVar37) * sVar37 | (ushort)(sVar93 >= sVar37) * sVar93;
                sVar37 = auVar116._10_2_;
                sVar93 = auVar102._10_2_;
                uVar96 = (ushort)(sVar93 < sVar37) * sVar37 | (ushort)(sVar93 >= sVar37) * sVar93;
                sVar37 = auVar116._12_2_;
                sVar93 = auVar102._12_2_;
                sVar98 = auVar102._14_2_;
                uVar97 = (ushort)(sVar93 < sVar37) * sVar37 | (ushort)(sVar93 >= sVar37) * sVar93;
                sVar37 = auVar116._14_2_;
                uVar82 = (ushort)(sVar98 < sVar37) * sVar37 | (ushort)(sVar98 >= sVar37) * sVar98;
                auVar102._0_2_ =
                     ((short)uVar101 < (short)uVar92) * uVar92 |
                     ((short)uVar101 >= (short)uVar92) * uVar101;
                auVar102._2_2_ =
                     ((short)uVar84 < (short)uVar75) * uVar75 |
                     ((short)uVar84 >= (short)uVar75) * uVar84;
                auVar102._4_2_ =
                     ((short)uVar86 < (short)uVar95) * uVar95 |
                     ((short)uVar86 >= (short)uVar95) * uVar86;
                auVar102._6_2_ =
                     ((short)uVar104 < (short)uVar78) * uVar78 |
                     ((short)uVar104 >= (short)uVar78) * uVar104;
                auVar102._8_2_ =
                     ((short)uVar88 < (short)uVar80) * uVar80 |
                     ((short)uVar88 >= (short)uVar80) * uVar88;
                auVar102._10_2_ =
                     ((short)uVar105 < (short)uVar96) * uVar96 |
                     ((short)uVar105 >= (short)uVar96) * uVar105;
                auVar102._12_2_ =
                     ((short)uVar106 < (short)uVar97) * uVar97 |
                     ((short)uVar106 >= (short)uVar97) * uVar106;
                auVar102._14_2_ =
                     ((short)uVar90 < (short)uVar82) * uVar82 |
                     ((short)uVar90 >= (short)uVar82) * uVar90;
                puVar2 = (ushort *)((long)*b_02 + lVar28);
                *puVar2 = (ushort)(sVar36 < sVar58) * sVar58 | (ushort)(sVar36 >= sVar58) * sVar36;
                puVar2[1] = (ushort)(sVar46 < sVar59) * sVar59 | (ushort)(sVar46 >= sVar59) * sVar46
                ;
                puVar2[2] = (ushort)(sVar47 < sVar60) * sVar60 | (ushort)(sVar47 >= sVar60) * sVar47
                ;
                puVar2[3] = (ushort)(sVar48 < sVar61) * sVar61 | (ushort)(sVar48 >= sVar61) * sVar48
                ;
                puVar2[4] = (ushort)(sVar49 < sVar62) * sVar62 | (ushort)(sVar49 >= sVar62) * sVar49
                ;
                puVar2[5] = (ushort)(sVar50 < sVar63) * sVar63 | (ushort)(sVar50 >= sVar63) * sVar50
                ;
                puVar2[6] = (ushort)(sVar51 < sVar64) * sVar64 | (ushort)(sVar51 >= sVar64) * sVar51
                ;
                puVar2[7] = (ushort)(sVar52 < sVar71) * sVar71 | (ushort)(sVar52 >= sVar71) * sVar52
                ;
                *(undefined1 (*) [16])((long)*b_03 + lVar28) = auVar108;
                *(undefined1 (*) [16])((long)*b_04 + lVar28) = auVar41;
                *(undefined1 (*) [16])((long)*b_05 + lVar28) = auVar72;
                auVar118._0_2_ =
                     (ushort)(sVar36 < sVar76) * sVar76 | (ushort)(sVar36 >= sVar76) * sVar36;
                auVar118._2_2_ =
                     (ushort)(sVar46 < sVar79) * sVar79 | (ushort)(sVar46 >= sVar79) * sVar46;
                auVar118._4_2_ =
                     (ushort)(sVar47 < sVar81) * sVar81 | (ushort)(sVar47 >= sVar81) * sVar47;
                auVar118._6_2_ =
                     (ushort)(sVar48 < sVar83) * sVar83 | (ushort)(sVar48 >= sVar83) * sVar48;
                auVar118._8_2_ =
                     (ushort)(sVar49 < sVar85) * sVar85 | (ushort)(sVar49 >= sVar85) * sVar49;
                auVar118._10_2_ =
                     (ushort)(sVar50 < sVar87) * sVar87 | (ushort)(sVar50 >= sVar87) * sVar50;
                auVar118._12_2_ =
                     (ushort)(sVar51 < sVar89) * sVar89 | (ushort)(sVar51 >= sVar89) * sVar51;
                auVar118._14_2_ =
                     (ushort)(sVar52 < sVar91) * sVar91 | (ushort)(sVar52 >= sVar91) * sVar52;
                auVar68 = pblendvb(auVar68,auVar115,auVar54);
                auVar41 = paddsw(auVar111,auVar113);
                auVar111 = pblendvb(auVar41,auVar110,auVar54);
                auVar41 = *(undefined1 (*) [16])((long)*palVar32 + lVar28);
                auVar65 = *(undefined1 (*) [16])((long)*palVar23 + lVar28);
                auVar72 = *(undefined1 (*) [16])((long)*palVar34 + lVar28);
                auVar108 = *(undefined1 (*) [16])((long)*palVar35 + lVar28);
                lVar28 = lVar28 + 0x10;
              } while (uVar33 << 4 != lVar28);
              uStack_170 = auVar74._8_8_;
              local_178 = palVar35;
              uStack_1a0 = auVar67._8_8_;
              local_1a8 = palVar34;
              uStack_130 = auVar77._8_8_;
              local_138 = palVar23;
              local_1d8 = local_188;
              if ((int)local_190 == iVar17) {
                local_1c0 = local_1e8;
                local_1d8 = palVar22;
              }
              iVar17 = 0;
              auVar116._4_4_ = uVar38;
              auVar116._0_4_ = uVar38;
              auVar116._8_4_ = uVar38;
              auVar116._12_4_ = uVar38;
              auVar13._4_4_ = uVar39;
              auVar13._0_4_ = uVar39;
              auVar13._8_4_ = uVar39;
              auVar13._12_4_ = uVar39;
              auVar41 = pmovsxbw(auVar65,0x101010101010101);
              do {
                auVar112._0_8_ = auVar111._0_8_ << 0x10;
                auVar112._8_8_ = auVar111._8_8_ << 0x10 | auVar111._0_8_ >> 0x30;
                auVar111 = pblendw(auVar112,_DAT_00905500,1);
                auVar114._0_8_ = auVar68._0_8_ << 0x10;
                auVar114._8_8_ = auVar68._8_8_ << 0x10 | auVar68._0_8_ >> 0x30;
                auVar65 = ZEXT416(0x8000);
                auVar68 = pblendw(auVar114,auVar65,1);
                auVar107._0_8_ = auVar109._0_8_ << 0x10;
                auVar107._8_8_ = auVar109._8_8_ << 0x10 | auVar109._0_8_ >> 0x30;
                auVar109 = pblendw(auVar107,auVar65,1);
                auVar117._0_8_ = auVar118._0_8_ << 0x10;
                auVar117._8_8_ = auVar118._8_8_ << 0x10 | auVar118._0_8_ >> 0x30;
                auVar118 = pblendw(auVar117,auVar65,1);
                uVar10 = palVar32[uVar24][0];
                auVar69._0_8_ = uVar10 << 0x10;
                auVar69._8_8_ = palVar32[uVar24][1] << 0x10 | uVar10 >> 0x30;
                auVar65 = pblendw(auVar69,auVar65,1);
                lVar28 = 0;
                auVar72 = local_128;
                do {
                  auVar65 = paddsw(auVar65,*(undefined1 (*) [16])((long)pvVar6 + lVar28 + lVar30));
                  psVar3 = (short *)((long)*b + lVar28);
                  sVar52 = *psVar3;
                  sVar58 = psVar3[1];
                  sVar59 = psVar3[2];
                  sVar60 = psVar3[3];
                  sVar61 = psVar3[4];
                  sVar62 = psVar3[5];
                  sVar63 = psVar3[6];
                  sVar64 = psVar3[7];
                  sVar37 = auVar118._0_2_;
                  auVar55._0_2_ =
                       (ushort)(sVar52 < sVar37) * sVar37 | (ushort)(sVar52 >= sVar37) * sVar52;
                  sVar36 = auVar118._2_2_;
                  auVar55._2_2_ =
                       (ushort)(sVar58 < sVar36) * sVar36 | (ushort)(sVar58 >= sVar36) * sVar58;
                  sVar46 = auVar118._4_2_;
                  auVar55._4_2_ =
                       (ushort)(sVar59 < sVar46) * sVar46 | (ushort)(sVar59 >= sVar46) * sVar59;
                  sVar47 = auVar118._6_2_;
                  auVar55._6_2_ =
                       (ushort)(sVar60 < sVar47) * sVar47 | (ushort)(sVar60 >= sVar47) * sVar60;
                  sVar48 = auVar118._8_2_;
                  auVar55._8_2_ =
                       (ushort)(sVar61 < sVar48) * sVar48 | (ushort)(sVar61 >= sVar48) * sVar61;
                  sVar49 = auVar118._10_2_;
                  auVar55._10_2_ =
                       (ushort)(sVar62 < sVar49) * sVar49 | (ushort)(sVar62 >= sVar49) * sVar62;
                  sVar50 = auVar118._12_2_;
                  auVar55._12_2_ =
                       (ushort)(sVar63 < sVar50) * sVar50 | (ushort)(sVar63 >= sVar50) * sVar63;
                  sVar51 = auVar118._14_2_;
                  auVar55._14_2_ =
                       (ushort)(sVar64 < sVar51) * sVar51 | (ushort)(sVar64 >= sVar51) * sVar64;
                  *(undefined1 (*) [16])((long)*b + lVar28) = auVar55;
                  auVar70._0_2_ = -(ushort)(auVar65._0_2_ == auVar55._0_2_);
                  auVar70._2_2_ = -(ushort)(auVar65._2_2_ == auVar55._2_2_);
                  auVar70._4_2_ = -(ushort)(auVar65._4_2_ == auVar55._4_2_);
                  auVar70._6_2_ = -(ushort)(auVar65._6_2_ == auVar55._6_2_);
                  auVar70._8_2_ = -(ushort)(auVar65._8_2_ == auVar55._8_2_);
                  auVar70._10_2_ = -(ushort)(auVar65._10_2_ == auVar55._10_2_);
                  auVar70._12_2_ = -(ushort)(auVar65._12_2_ == auVar55._12_2_);
                  auVar70._14_2_ = -(ushort)(auVar65._14_2_ == auVar55._14_2_);
                  auVar43._0_2_ = -(ushort)(sVar37 < sVar52);
                  auVar43._2_2_ = -(ushort)(sVar36 < sVar58);
                  auVar43._4_2_ = -(ushort)(sVar46 < sVar59);
                  auVar43._6_2_ = -(ushort)(sVar47 < sVar60);
                  auVar43._8_2_ = -(ushort)(sVar48 < sVar61);
                  auVar43._10_2_ = -(ushort)(sVar49 < sVar62);
                  auVar43._12_2_ = -(ushort)(sVar50 < sVar63);
                  auVar43._14_2_ = -(ushort)(sVar51 < sVar64);
                  auVar43 = auVar43 | auVar70;
                  auVar108 = pblendvb(auVar109,*(undefined1 (*) [16])((long)*palVar20 + lVar28),
                                      auVar43);
                  *(undefined1 (*) [16])((long)*palVar20 + lVar28) = auVar108;
                  auVar77 = pblendvb(auVar68,*(undefined1 (*) [16])((long)*b_00 + lVar28),auVar43);
                  *(undefined1 (*) [16])((long)*b_00 + lVar28) = auVar77;
                  auVar74 = pblendvb(auVar111,*(undefined1 (*) [16])((long)*b_01 + lVar28),auVar43);
                  *(undefined1 (*) [16])((long)*b_01 + lVar28) = auVar74;
                  sVar37 = auVar108._0_2_;
                  sVar36 = auVar102._0_2_;
                  uVar92 = (ushort)(sVar36 < sVar37) * sVar37 | (ushort)(sVar36 >= sVar37) * sVar36;
                  sVar37 = auVar108._2_2_;
                  sVar36 = auVar102._2_2_;
                  uVar75 = (ushort)(sVar36 < sVar37) * sVar37 | (ushort)(sVar36 >= sVar37) * sVar36;
                  sVar37 = auVar108._4_2_;
                  sVar36 = auVar102._4_2_;
                  uVar95 = (ushort)(sVar36 < sVar37) * sVar37 | (ushort)(sVar36 >= sVar37) * sVar36;
                  sVar37 = auVar108._6_2_;
                  sVar36 = auVar102._6_2_;
                  uVar78 = (ushort)(sVar36 < sVar37) * sVar37 | (ushort)(sVar36 >= sVar37) * sVar36;
                  sVar37 = auVar108._8_2_;
                  sVar36 = auVar102._8_2_;
                  uVar80 = (ushort)(sVar36 < sVar37) * sVar37 | (ushort)(sVar36 >= sVar37) * sVar36;
                  sVar37 = auVar108._10_2_;
                  sVar36 = auVar102._10_2_;
                  uVar96 = (ushort)(sVar36 < sVar37) * sVar37 | (ushort)(sVar36 >= sVar37) * sVar36;
                  sVar37 = auVar108._12_2_;
                  sVar36 = auVar102._12_2_;
                  sVar46 = auVar102._14_2_;
                  uVar97 = (ushort)(sVar36 < sVar37) * sVar37 | (ushort)(sVar36 >= sVar37) * sVar36;
                  sVar37 = auVar108._14_2_;
                  uVar82 = (ushort)(sVar46 < sVar37) * sVar37 | (ushort)(sVar46 >= sVar37) * sVar46;
                  sVar37 = auVar74._0_2_;
                  sVar36 = auVar77._0_2_;
                  uVar101 = (ushort)(sVar36 < sVar37) * sVar37 | (ushort)(sVar36 >= sVar37) * sVar36
                  ;
                  sVar37 = auVar74._2_2_;
                  sVar36 = auVar77._2_2_;
                  uVar84 = (ushort)(sVar36 < sVar37) * sVar37 | (ushort)(sVar36 >= sVar37) * sVar36;
                  sVar37 = auVar74._4_2_;
                  sVar36 = auVar77._4_2_;
                  uVar86 = (ushort)(sVar36 < sVar37) * sVar37 | (ushort)(sVar36 >= sVar37) * sVar36;
                  sVar37 = auVar74._6_2_;
                  sVar36 = auVar77._6_2_;
                  uVar104 = (ushort)(sVar36 < sVar37) * sVar37 | (ushort)(sVar36 >= sVar37) * sVar36
                  ;
                  sVar37 = auVar74._8_2_;
                  sVar36 = auVar77._8_2_;
                  uVar88 = (ushort)(sVar36 < sVar37) * sVar37 | (ushort)(sVar36 >= sVar37) * sVar36;
                  sVar37 = auVar74._10_2_;
                  sVar36 = auVar77._10_2_;
                  uVar105 = (ushort)(sVar36 < sVar37) * sVar37 | (ushort)(sVar36 >= sVar37) * sVar36
                  ;
                  sVar37 = auVar74._12_2_;
                  sVar36 = auVar77._12_2_;
                  sVar46 = auVar77._14_2_;
                  uVar106 = (ushort)(sVar36 < sVar37) * sVar37 | (ushort)(sVar36 >= sVar37) * sVar36
                  ;
                  sVar37 = auVar74._14_2_;
                  uVar90 = (ushort)(sVar46 < sVar37) * sVar37 | (ushort)(sVar46 >= sVar37) * sVar46;
                  auVar102._0_2_ =
                       ((short)uVar101 < (short)uVar92) * uVar92 |
                       ((short)uVar101 >= (short)uVar92) * uVar101;
                  auVar102._2_2_ =
                       ((short)uVar84 < (short)uVar75) * uVar75 |
                       ((short)uVar84 >= (short)uVar75) * uVar84;
                  auVar102._4_2_ =
                       ((short)uVar86 < (short)uVar95) * uVar95 |
                       ((short)uVar86 >= (short)uVar95) * uVar86;
                  auVar102._6_2_ =
                       ((short)uVar104 < (short)uVar78) * uVar78 |
                       ((short)uVar104 >= (short)uVar78) * uVar104;
                  auVar102._8_2_ =
                       ((short)uVar88 < (short)uVar80) * uVar80 |
                       ((short)uVar88 >= (short)uVar80) * uVar88;
                  auVar102._10_2_ =
                       ((short)uVar105 < (short)uVar96) * uVar96 |
                       ((short)uVar105 >= (short)uVar96) * uVar105;
                  auVar102._12_2_ =
                       ((short)uVar106 < (short)uVar97) * uVar97 |
                       ((short)uVar106 >= (short)uVar97) * uVar106;
                  auVar102._14_2_ =
                       ((short)uVar90 < (short)uVar82) * uVar82 |
                       ((short)uVar90 >= (short)uVar82) * uVar90;
                  sVar37 = auVar72._0_2_;
                  local_128._0_2_ =
                       (sVar37 < (short)auVar55._0_2_) * auVar55._0_2_ |
                       (ushort)(sVar37 >= (short)auVar55._0_2_) * sVar37;
                  sVar37 = auVar72._2_2_;
                  local_128._2_2_ =
                       (sVar37 < (short)auVar55._2_2_) * auVar55._2_2_ |
                       (ushort)(sVar37 >= (short)auVar55._2_2_) * sVar37;
                  sVar37 = auVar72._4_2_;
                  local_128._4_2_ =
                       (sVar37 < (short)auVar55._4_2_) * auVar55._4_2_ |
                       (ushort)(sVar37 >= (short)auVar55._4_2_) * sVar37;
                  sVar37 = auVar72._6_2_;
                  local_128._6_2_ =
                       (sVar37 < (short)auVar55._6_2_) * auVar55._6_2_ |
                       (ushort)(sVar37 >= (short)auVar55._6_2_) * sVar37;
                  sVar37 = auVar72._8_2_;
                  local_128._8_2_ =
                       (sVar37 < (short)auVar55._8_2_) * auVar55._8_2_ |
                       (ushort)(sVar37 >= (short)auVar55._8_2_) * sVar37;
                  sVar37 = auVar72._10_2_;
                  local_128._10_2_ =
                       (sVar37 < (short)auVar55._10_2_) * auVar55._10_2_ |
                       (ushort)(sVar37 >= (short)auVar55._10_2_) * sVar37;
                  sVar37 = auVar72._12_2_;
                  sVar36 = auVar72._14_2_;
                  local_128._12_2_ =
                       (sVar37 < (short)auVar55._12_2_) * auVar55._12_2_ |
                       (ushort)(sVar37 >= (short)auVar55._12_2_) * sVar37;
                  local_128._14_2_ =
                       (sVar36 < (short)auVar55._14_2_) * auVar55._14_2_ |
                       (ushort)(sVar36 >= (short)auVar55._14_2_) * sVar36;
                  auVar65 = psubsw(auVar55,auVar116);
                  auVar118 = psubsw(auVar118,auVar13);
                  sVar37 = auVar118._0_2_;
                  sVar52 = auVar65._0_2_;
                  auVar100._0_2_ = -(ushort)(sVar52 < sVar37);
                  sVar36 = auVar118._2_2_;
                  sVar58 = auVar65._2_2_;
                  auVar100._2_2_ = -(ushort)(sVar58 < sVar36);
                  sVar46 = auVar118._4_2_;
                  sVar59 = auVar65._4_2_;
                  auVar100._4_2_ = -(ushort)(sVar59 < sVar46);
                  sVar47 = auVar118._6_2_;
                  sVar60 = auVar65._6_2_;
                  auVar100._6_2_ = -(ushort)(sVar60 < sVar47);
                  sVar48 = auVar118._8_2_;
                  sVar61 = auVar65._8_2_;
                  auVar100._8_2_ = -(ushort)(sVar61 < sVar48);
                  sVar49 = auVar118._10_2_;
                  sVar62 = auVar65._10_2_;
                  auVar100._10_2_ = -(ushort)(sVar62 < sVar49);
                  sVar50 = auVar118._12_2_;
                  sVar63 = auVar65._12_2_;
                  sVar51 = auVar118._14_2_;
                  auVar100._12_2_ = -(ushort)(sVar63 < sVar50);
                  sVar64 = auVar65._14_2_;
                  auVar100._14_2_ = -(ushort)(sVar64 < sVar51);
                  auVar94._0_2_ = -(ushort)(sVar37 == sVar52);
                  auVar94._2_2_ = -(ushort)(sVar36 == sVar58);
                  auVar94._4_2_ = -(ushort)(sVar46 == sVar59);
                  auVar94._6_2_ = -(ushort)(sVar47 == sVar60);
                  auVar94._8_2_ = -(ushort)(sVar48 == sVar61);
                  auVar94._10_2_ = -(ushort)(sVar49 == sVar62);
                  auVar94._12_2_ = -(ushort)(sVar50 == sVar63);
                  auVar94._14_2_ = -(ushort)(sVar51 == sVar64);
                  auVar99._0_2_ = -(ushort)(-0x8000 < sVar37);
                  auVar99._2_2_ = -(ushort)(-0x8000 < sVar36);
                  auVar99._4_2_ = -(ushort)(-0x8000 < sVar46);
                  auVar99._6_2_ = -(ushort)(-0x8000 < sVar47);
                  auVar99._8_2_ = -(ushort)(-0x8000 < sVar48);
                  auVar99._10_2_ = -(ushort)(-0x8000 < sVar49);
                  auVar99._12_2_ = -(ushort)(-0x8000 < sVar50);
                  auVar99._14_2_ = -(ushort)(-0x8000 < sVar51);
                  auVar100 = auVar99 & auVar94 | auVar100;
                  if ((((((((((((((((auVar100 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                   && (auVar100 >> 0xf & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                  (auVar100 >> 0x17 & (undefined1  [16])0x1) ==
                                  (undefined1  [16])0x0) &&
                                 (auVar100 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                 ) && (auVar100 >> 0x27 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                               (auVar100 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                              && (auVar100 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                              ) && (auVar100 >> 0x3f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                            (auVar100 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar100 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar100 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar100 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar100 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar100 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar100 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < auVar100[0xf]) goto LAB_006ae24b;
                  auVar56._0_2_ = -(ushort)(sVar37 < sVar52);
                  auVar56._2_2_ = -(ushort)(sVar36 < sVar58);
                  auVar56._4_2_ = -(ushort)(sVar46 < sVar59);
                  auVar56._6_2_ = -(ushort)(sVar47 < sVar60);
                  auVar56._8_2_ = -(ushort)(sVar48 < sVar61);
                  auVar56._10_2_ = -(ushort)(sVar49 < sVar62);
                  auVar56._12_2_ = -(ushort)(sVar50 < sVar63);
                  auVar56._14_2_ = -(ushort)(sVar51 < sVar64);
                  auVar109 = pblendvb(auVar109,auVar108,auVar56);
                  auVar68 = pblendvb(auVar68,auVar77,auVar56);
                  auVar72 = paddsw(auVar111,auVar41);
                  auVar65 = paddsw(auVar74,auVar41);
                  auVar111 = pblendvb(auVar72,auVar65,auVar56);
                  auVar65 = *(undefined1 (*) [16])((long)*palVar32 + lVar28);
                  lVar28 = lVar28 + 0x10;
                  auVar72 = local_128;
                } while (uVar33 << 4 != lVar28);
                iVar17 = iVar17 + 1;
              } while (iVar17 != 8);
LAB_006ae24b:
              auVar44._0_2_ = -(ushort)(auVar57._0_2_ < (short)local_128._0_2_);
              auVar44._2_2_ = -(ushort)(auVar57._2_2_ < (short)local_128._2_2_);
              auVar44._4_2_ = -(ushort)(auVar57._4_2_ < (short)local_128._4_2_);
              auVar44._6_2_ = -(ushort)(auVar57._6_2_ < (short)local_128._6_2_);
              auVar44._8_2_ = -(ushort)(auVar57._8_2_ < (short)local_128._8_2_);
              auVar44._10_2_ = -(ushort)(auVar57._10_2_ < (short)local_128._10_2_);
              auVar44._12_2_ = -(ushort)(auVar57._12_2_ < (short)local_128._12_2_);
              auVar44._14_2_ = -(ushort)(auVar57._14_2_ < (short)local_128._14_2_);
              local_1e8 = palVar32;
              if ((((((((((((((((auVar44 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar44 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar44 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar44 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar44 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar44 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar44 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar44 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar44 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar44 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar44 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar44 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar44 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar44 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar44._14_2_ >> 7 & 1) != 0) || (auVar44._14_2_ & 0x8000) != 0) {
                auVar41 = phminposuw(local_128 ^ _DAT_00905510);
                local_1dc = auVar41._0_4_ ^ 0x7fff;
                if ((short)(0x7ffe - (short)iVar18) < (short)local_1dc) {
                  *(byte *)&result_00->flag = (byte)result_00->flag | 0x40;
                  goto LAB_006ae321;
                }
                uVar92 = (ushort)((short)local_128._8_2_ < (short)local_128._0_2_) * local_128._0_2_
                         | (ushort)((short)local_128._8_2_ >= (short)local_128._0_2_) *
                           local_128._8_2_;
                uVar75 = (ushort)((short)local_128._10_2_ < (short)local_128._2_2_) *
                         local_128._2_2_ |
                         (ushort)((short)local_128._10_2_ >= (short)local_128._2_2_) *
                         local_128._10_2_;
                uVar95 = (ushort)((short)local_128._12_2_ < (short)local_128._4_2_) *
                         local_128._4_2_ |
                         (ushort)((short)local_128._12_2_ >= (short)local_128._4_2_) *
                         local_128._12_2_;
                uVar78 = (ushort)((short)local_128._14_2_ < (short)local_128._6_2_) *
                         local_128._6_2_ |
                         (ushort)((short)local_128._14_2_ >= (short)local_128._6_2_) *
                         local_128._14_2_;
                sVar36 = (ushort)(0 < (short)local_128._8_2_) * local_128._8_2_;
                sVar37 = (ushort)(0 < (short)local_128._10_2_) * local_128._10_2_;
                sVar47 = (ushort)(0 < (short)local_128._12_2_) * local_128._12_2_;
                sVar46 = (ushort)(0 < (short)local_128._14_2_) * local_128._14_2_;
                uVar92 = ((short)uVar95 < (short)uVar92) * uVar92 |
                         ((short)uVar95 >= (short)uVar92) * uVar95;
                uVar75 = ((short)uVar78 < (short)uVar75) * uVar75 |
                         ((short)uVar78 >= (short)uVar75) * uVar78;
                uVar95 = (sVar36 < (short)uVar95) * uVar95 |
                         (ushort)(sVar36 >= (short)uVar95) * sVar36;
                uVar78 = (sVar37 < (short)uVar78) * uVar78 |
                         (ushort)(sVar37 >= (short)uVar78) * sVar37;
                uVar80 = (ushort)(sVar47 < sVar36) * sVar36 | (ushort)(sVar47 >= sVar36) * sVar47;
                uVar96 = (ushort)(sVar46 < sVar37) * sVar37 | (ushort)(sVar46 >= sVar37) * sVar46;
                sVar47 = (ushort)(0 < sVar47) * sVar47;
                sVar46 = (ushort)(0 < sVar46) * sVar46;
                auVar45._0_2_ =
                     ((short)uVar75 < (short)uVar92) * uVar92 |
                     ((short)uVar75 >= (short)uVar92) * uVar75;
                auVar45._2_2_ =
                     ((short)uVar95 < (short)uVar75) * uVar75 |
                     ((short)uVar95 >= (short)uVar75) * uVar95;
                auVar45._4_2_ =
                     ((short)uVar78 < (short)uVar95) * uVar95 |
                     ((short)uVar78 >= (short)uVar95) * uVar78;
                auVar45._6_2_ =
                     ((short)uVar80 < (short)uVar78) * uVar78 |
                     ((short)uVar80 >= (short)uVar78) * uVar80;
                auVar45._8_2_ =
                     ((short)uVar96 < (short)uVar80) * uVar80 |
                     ((short)uVar96 >= (short)uVar80) * uVar96;
                auVar45._10_2_ =
                     (sVar47 < (short)uVar96) * uVar96 | (ushort)(sVar47 >= (short)uVar96) * sVar47;
                auVar45._12_2_ =
                     (ushort)(sVar46 < sVar47) * sVar47 | (ushort)(sVar46 >= sVar47) * sVar46;
                auVar45._14_2_ = (ushort)(0 < sVar46) * sVar46;
                auVar41 = pshuflw(auVar45,auVar45,0);
                uVar40 = auVar41._0_4_;
                auVar57._4_4_ = uVar40;
                auVar57._0_4_ = uVar40;
                auVar57._8_4_ = uVar40;
                auVar57._12_4_ = uVar40;
                local_190 = uVar27 & 0xffffffff;
              }
              uVar27 = uVar27 + 1;
              local_1c8 = palVar21;
              local_188 = local_1d8;
            } while (uVar27 != iVar4 + 1U);
            uVar27 = (ulong)(iVar4 + 1U);
LAB_006ae321:
            if ((short)local_1dc == 0x7fff) {
LAB_006ae345:
              *(byte *)&result_00->flag = (byte)result_00->flag | 0x40;
            }
            else {
              auVar103._0_2_ = -(ushort)(auVar102._0_2_ == 0x7fff);
              auVar103._2_2_ = -(ushort)(auVar102._2_2_ == 0x7fff);
              auVar103._4_2_ = -(ushort)(auVar102._4_2_ == 0x7fff);
              auVar103._6_2_ = -(ushort)(auVar102._6_2_ == 0x7fff);
              auVar103._8_2_ = -(ushort)(auVar102._8_2_ == 0x7fff);
              auVar103._10_2_ = -(ushort)(auVar102._10_2_ == 0x7fff);
              auVar103._12_2_ = -(ushort)(auVar102._12_2_ == 0x7fff);
              auVar103._14_2_ = -(ushort)(auVar102._14_2_ == 0x7fff);
              if ((((((((((((((((auVar103 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar103 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar103 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                              ) || (auVar103 >> 0x1f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                            (auVar103 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar103 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar103 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar103 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar103 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar103 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar103 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar103 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar103 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar103 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar103._14_2_ >> 7 & 1) != 0) || (auVar103._14_2_ & 0x8000) != 0)
              goto LAB_006ae345;
            }
            iVar18 = parasail_result_is_saturated(result_00);
            if (iVar18 == 0) {
              ptr_00 = palVar21;
              palVar14 = b_01;
              palVar22 = b;
              palVar31 = palVar20;
              ptr_01 = local_1c0;
              ptr_02 = local_1d8;
              ptr_03 = ptr;
              palVar15 = b_00;
              if (((int)local_190 != (int)uVar27 + -1) &&
                 (ptr_00 = palVar20, palVar14 = ptr, palVar22 = local_1c0, palVar31 = palVar21,
                 ptr_01 = b, ptr_02 = b_00, ptr_03 = b_01, palVar15 = local_1d8,
                 (int)local_190 == (int)uVar27 + -2)) {
                local_1e8 = local_1c0;
                local_1a8 = local_1d8;
                local_178 = ptr;
                palVar14 = palVar35;
                palVar22 = palVar32;
                palVar31 = palVar23;
                palVar15 = palVar34;
                local_138 = palVar21;
              }
              local_1d8 = palVar15;
              ptr = palVar14;
              if ((uVar19 + 7 & 0x7ffffff8) == 0) {
                iVar18 = 0;
                iVar17 = 0;
                iVar25 = 0;
              }
              else {
                local_128._0_2_ = -0x8000;
                uVar33 = 0;
                sVar37 = -0x8000;
                sVar36 = -0x8000;
                do {
                  if ((*(short *)((long)*palVar22 + uVar33 * 2) == (short)local_1dc) &&
                     (uVar29 = ((uint)uVar33 & 7) * uVar9 + ((uint)(uVar33 >> 3) & 0x1fffffff),
                     (int)uVar29 < (int)uVar19)) {
                    local_128._0_2_ = *(short *)((long)*palVar31 + uVar33 * 2);
                    sVar37 = *(short *)((long)*local_1d8 + uVar33 * 2);
                    sVar36 = *(short *)((long)*ptr + uVar33 * 2);
                    uVar19 = (ulong)uVar29;
                  }
                  uVar29 = (uint)uVar19;
                  uVar33 = uVar33 + 1;
                } while ((uVar9 & 0xfffffff) << 3 != (int)uVar33);
                iVar25 = (short)local_128._0_2_ + 0x8000;
                iVar17 = sVar37 + 0x8000;
                iVar18 = sVar36 + 0x8000;
              }
              local_e8 = SUB84(palVar31,0);
              uStack_e4 = (undefined4)((ulong)palVar31 >> 0x20);
              iVar26 = (short)local_1dc + 0x8000;
            }
            else {
              local_190._0_4_ = 0;
              iVar18 = 0x8000;
              iVar17 = 0x8000;
              iVar25 = 0x8000;
              iVar26 = 0x8000;
              local_e8 = SUB84(palVar21,0);
              uStack_e4 = (undefined4)((ulong)palVar21 >> 0x20);
              uVar29 = 0;
              ptr_00 = palVar20;
              ptr_01 = b;
              ptr_02 = b_00;
              ptr_03 = b_01;
              palVar22 = local_1c0;
            }
            result_00->score = iVar26;
            result_00->end_query = uVar29;
            result_00->end_ref = (int)local_190;
            ((result_00->field_4).stats)->matches = iVar25;
            ((result_00->field_4).stats)->similar = iVar17;
            ((result_00->field_4).stats)->length = iVar18;
            parasail_free(ptr);
            parasail_free(local_1d8);
            parasail_free((void *)CONCAT44(uStack_e4,local_e8));
            parasail_free(palVar22);
            parasail_free(b_05);
            parasail_free(b_04);
            parasail_free(b_03);
            parasail_free(b_02);
            parasail_free(local_178);
            parasail_free(ptr_03);
            parasail_free(local_1a8);
            parasail_free(ptr_02);
            parasail_free(local_138);
            parasail_free(ptr_00);
            parasail_free(local_1e8);
            parasail_free(ptr_01);
            goto LAB_006ae65e;
          }
        }
      }
    }
  }
  result_00 = (parasail_result_t *)0x0;
LAB_006ae65e:
  parasail_profile_free(profile_00);
  parasail_result_free(result);
  result_00->end_query = iVar16;
  result_00->end_ref = iVar4;
  return result_00;
}

Assistant:

parasail_result_t* INAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    const char *s1 = profile->s1;
    const parasail_matrix_t *matrix = profile->matrix;

    /* find the end loc first with the faster implementation */
    parasail_result_t *result = parasail_sw_striped_profile_sse41_128_16(profile, s2, s2Len, open, gap);
    if (!parasail_result_is_saturated(result)) {
#if 0
        int s1Len_new = 0;
        int s2Len_new = 0;
        char *s1_new = NULL;
        char *s2_new = NULL;
        parasail_profile_t *profile_new = NULL;
        parasail_result_t *result_new = NULL;
        int s1_begin = 0;
        int s2_begin = 0;
        int s1Len_final = 0;
        int s2Len_final = 0;
        parasail_profile_t *profile_final = NULL;
        parasail_result_t *result_final = NULL;

        /* using the end loc and the non-stats version of the function,
         * reverse the inputs and find the beg loc */
        s1Len_new = result->end_query+1;
        s2Len_new = result->end_ref+1;
        s1_new = parasail_reverse(s1, s1Len_new);
        s2_new = parasail_reverse(s2, s2Len_new);
        profile_new = parasail_profile_create_sse_128_16(
                s1_new, s1Len_new, matrix);
        profile_new->stop = result->score;
        result_new = parasail_sw_striped_profile_sse41_128_16(
                profile_new, s2_new, s2Len_new, open, gap);

        /* using both the beg and end loc, call the original stats func */
        s1_begin = s1Len_new - result_new->end_query - 1;
        s2_begin = s2Len_new - result_new->end_ref - 1;
        s1Len_final = s1Len_new - s1_begin;
        s2Len_final = s2Len_new - s2_begin;
        assert(s1_begin >= 0);
        assert(s2_begin >= 0);
        assert(s1Len_new > s1_begin);
        assert(s2Len_new > s2_begin);
        profile_final = parasail_profile_create_stats_sse_128_16(
                &s1[s1_begin], s1Len_final, matrix);
        result_final = PNAME(
                profile_final, &s2[s2_begin], s2Len_final, open, gap);

        /* clean up all the temporary profiles, sequences, and results */
        free(s1_new);
        free(s2_new);
        parasail_profile_free(profile_new);
        parasail_profile_free(profile_final);
        parasail_result_free(result);
        parasail_result_free(result_new);

        /* correct the end locations before returning */
        result_final->end_query = s1Len_new-1;
        result_final->end_ref = s2Len_new-1;
        return result_final;
#else
        int s1Len_new = 0;
        int s2Len_new = 0;
        parasail_profile_t *profile_final = NULL;
        parasail_result_t *result_final = NULL;

        /* using the end loc, call the original stats function */
        s1Len_new = result->end_query+1;
        s2Len_new = result->end_ref+1;
        profile_final = parasail_profile_create_stats_sse_128_16(
                s1, s1Len_new, matrix);
        result_final = PNAME(
                profile_final, s2, s2Len_new, open, gap);

        /* clean up all the temporary profiles, sequences, and results */
        parasail_profile_free(profile_final);
        parasail_result_free(result);

        /* correct the end locations before returning */
        result_final->end_query = s1Len_new-1;
        result_final->end_ref = s2Len_new-1;
        return result_final;
#endif
    }
    else {
        return result;
    }
}